

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConvertVisitor.cpp
# Opt level: O2

string * __thiscall
CConvertVisitor::GetResult_abi_cxx11_(string *__return_storage_ptr__,CConvertVisitor *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->code);
  return __return_storage_ptr__;
}

Assistant:

std::string CConvertVisitor::GetResult() {
	return code;
}